

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImGuiID IVar7;
  ImGuiWindow *pIVar8;
  ImDrawList *this;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiContext *pIVar11;
  int iVar12;
  ImU32 col;
  float fVar13;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec4 local_48;
  
  pIVar11 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2b09,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount == -1) {
    __assert_fail("payload.DataFrameCount != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2b0a,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  pIVar8 = GImGui->CurrentWindow;
  if ((type == (char *)0x0) ||
     (((GImGui->DragDropPayload).DataFrameCount != -1 &&
      (iVar12 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar12 == 0)))) {
    IVar6 = pIVar11->DragDropAcceptIdPrev;
    IVar7 = pIVar11->DragDropTargetId;
    fVar1 = (pIVar11->DragDropTargetRect).Min.x;
    fVar2 = (pIVar11->DragDropTargetRect).Min.y;
    fVar3 = (pIVar11->DragDropTargetRect).Max.x;
    fVar4 = (pIVar11->DragDropTargetRect).Max.y;
    fVar13 = (fVar4 - fVar2) * (fVar3 - fVar1);
    if (fVar13 <= pIVar11->DragDropAcceptIdCurrRectSurface) {
      pIVar11->DragDropAcceptFlags = flags;
      pIVar11->DragDropAcceptIdCurr = IVar7;
      pIVar11->DragDropAcceptIdCurrRectSurface = fVar13;
    }
    (pIVar11->DragDropPayload).Preview = IVar6 == IVar7;
    if (((pIVar11->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar6 == IVar7) {
      this = pIVar8->DrawList;
      local_58.y = fVar2 + -3.5;
      local_58.x = fVar1 + -3.5;
      local_50.y = fVar4 + 3.5;
      local_50.x = fVar3 + 3.5;
      local_48.x = (pIVar11->Style).Colors[0x32].x;
      local_48.y = (pIVar11->Style).Colors[0x32].y;
      uVar9 = (pIVar11->Style).Colors[0x32].z;
      uVar10 = (pIVar11->Style).Colors[0x32].w;
      local_48.w = (pIVar11->Style).Alpha * (float)uVar10;
      local_48.z = (float)uVar9;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&local_50,col,0.0,0,2.0);
    }
    pIVar11->DragDropAcceptFrameCount = pIVar11->FrameCount;
    if (IVar6 == IVar7) {
      if (4 < (ulong)(uint)pIVar11->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1394,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
      }
      bVar5 = (GImGui->IO).MouseDown[(uint)pIVar11->DragDropMouseButton];
      (pIVar11->DragDropPayload).Delivery = (bool)(bVar5 ^ 1);
      if ((((uint)flags >> 10 & 1) != 0) || (bVar5 == false)) {
LAB_0013e477:
        return &pIVar11->DragDropPayload;
      }
    }
    else {
      (pIVar11->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) goto LAB_0013e477;
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}